

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::Get(DBImpl *this,ReadOptions *options,Slice *key,string *value)

{
  Snapshot **__mutex;
  _func_int **pp_Var1;
  MemTable *this_00;
  MemTable *this_01;
  Version *this_02;
  VersionSet *pVVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  Snapshot *pSVar6;
  string *in_R8;
  long in_FS_OFFSET;
  GetStats stats;
  LookupKey lkey;
  undefined1 local_130 [24];
  LookupKey local_118;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  __mutex = &options[0xc].snapshot;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    pSVar6 = (Snapshot *)(key->size_ + 0x18);
    if (key->size_ == 0) {
      pSVar6 = options[0x22].snapshot + 0xb;
    }
    pp_Var1 = pSVar6->_vptr_Snapshot;
    this_00 = *(MemTable **)(options + 0x13);
    this_01 = (MemTable *)options[0x13].snapshot;
    this_02 = (Version *)options[0x22].snapshot[0x2d]._vptr_Snapshot;
    this_00->refs_ = this_00->refs_ + 1;
    if (this_01 != (MemTable *)0x0) {
      this_01->refs_ = this_01->refs_ + 1;
    }
    Version::Ref(this_02);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    LookupKey::LookupKey(&local_118,(Slice *)value,(SequenceNumber)pp_Var1);
    bVar3 = MemTable::Get(this_00,&local_118,in_R8,(Status *)this);
    if (bVar3) {
LAB_00cf018b:
      bVar3 = false;
    }
    else {
      if (this_01 != (MemTable *)0x0) {
        bVar3 = MemTable::Get(this_01,&local_118,in_R8,(Status *)this);
        if (bVar3) goto LAB_00cf018b;
      }
      Version::Get((Version *)local_130,(ReadOptions *)this_02,(LookupKey *)key,(string *)&local_118
                   ,(GetStats *)in_R8);
      pVVar2 = (VersionSet *)(this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_130._0_8_;
      local_130._0_8_ = pVVar2;
      if (pVVar2 != (VersionSet *)0x0) {
        operator_delete__(pVVar2);
      }
      bVar3 = true;
    }
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 == 0) {
      if (local_118.start_ != (char *)0x0 && local_118.start_ != local_118.space_) {
        operator_delete__(local_118.start_);
      }
      if (bVar3) {
        bVar3 = Version::UpdateStats(this_02,(GetStats *)(local_130 + 8));
        if (bVar3) {
          MaybeScheduleCompaction((DBImpl *)options);
        }
      }
      MemTable::Unref(this_00);
      if (this_01 != (MemTable *)0x0) {
        MemTable::Unref(this_01);
      }
      Version::Unref(this_02);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return (Status)(char *)this;
      }
      goto LAB_00cf032c;
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00cf032c;
    iVar4 = std::__throw_system_error(iVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar5 = std::__throw_system_error(iVar4);
    if (local_118.start_ != (char *)0x0 && local_118.start_ != local_118.space_) {
      operator_delete__(local_118.start_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    pp_Var1 = (this->super_DB)._vptr_DB;
    if (pp_Var1 != (_func_int **)0x0) {
      operator_delete__(pp_Var1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(uVar5);
    }
  }
LAB_00cf032c:
  __stack_chk_fail();
}

Assistant:

Status DBImpl::Get(const ReadOptions& options, const Slice& key,
                   std::string* value) {
  Status s;
  MutexLock l(&mutex_);
  SequenceNumber snapshot;
  if (options.snapshot != nullptr) {
    snapshot =
        static_cast<const SnapshotImpl*>(options.snapshot)->sequence_number();
  } else {
    snapshot = versions_->LastSequence();
  }

  MemTable* mem = mem_;
  MemTable* imm = imm_;
  Version* current = versions_->current();
  mem->Ref();
  if (imm != nullptr) imm->Ref();
  current->Ref();

  bool have_stat_update = false;
  Version::GetStats stats;

  // Unlock while reading from files and memtables
  {
    mutex_.Unlock();
    // First look in the memtable, then in the immutable memtable (if any).
    LookupKey lkey(key, snapshot);
    if (mem->Get(lkey, value, &s)) {
      // Done
    } else if (imm != nullptr && imm->Get(lkey, value, &s)) {
      // Done
    } else {
      s = current->Get(options, lkey, value, &stats);
      have_stat_update = true;
    }
    mutex_.Lock();
  }

  if (have_stat_update && current->UpdateStats(stats)) {
    MaybeScheduleCompaction();
  }
  mem->Unref();
  if (imm != nullptr) imm->Unref();
  current->Unref();
  return s;
}